

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O3

void __thiscall
CDirectiveData::setNormal
          (CDirectiveData *this,vector<Expression,_std::allocator<Expression>_> *entries,
          size_t unitSize)

{
  unsigned_long *in_RCX;
  size_t local_18;
  
  local_18 = unitSize;
  if ((unitSize - 1 < 8) &&
     (in_RCX = (unsigned_long *)0x8b, (0x8bU >> ((uint)(unitSize - 1) & 0x1f) & 1) != 0)) {
    this->mode = *(EncodingMode *)("0x%16lx," + unitSize * 4 + 6);
    std::vector<Expression,_std::allocator<Expression>_>::operator=(&this->entries,entries);
    this->writeTermination = false;
    std::vector<long,_std::allocator<long>_>::reserve
              (&this->normalData,
               ((long)(entries->super__Vector_base<Expression,_std::allocator<Expression>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(entries->super__Vector_base<Expression,_std::allocator<Expression>_>)._M_impl
                      .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    return;
  }
  Logger::printError<unsigned_long>((Logger *)0x1,0x1942fb,(char *)&local_18,in_RCX);
  return;
}

Assistant:

void CDirectiveData::setNormal(std::vector<Expression>& entries, size_t unitSize)
{
	switch (unitSize)
	{
	case 1:
		this->mode = EncodingMode::U8;
		break;
	case 2:
		this->mode = EncodingMode::U16;
		break;
	case 4:
		this->mode = EncodingMode::U32;
		break;
	case 8:
		this->mode = EncodingMode::U64;
		break;
	default:
		Logger::printError(Logger::Error, "Invalid data unit size %d",unitSize);
		return;
	}
	
	this->entries = entries;
	this->writeTermination = false;
	normalData.reserve(entries.size());
}